

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O0

void __thiscall capnp::TextCodec::decode(TextCodec *this,StringPtr input,Builder output)

{
  StringPtr input_00;
  TextCodec *this_local;
  StringPtr input_local;
  
  input_00.content.size_ = (size_t)&output;
  input_00.content.ptr = (char *)input.content.size_;
  ::(anonymous_namespace)::
  lexAndParseExpression<capnp::TextCodec::decode(kj::StringPtr,capnp::DynamicStruct::Builder)const::__0>
            ((_anonymous_namespace_ *)input.content.ptr,input_00,(Builder *)input.content.size_);
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&output](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.");

    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}